

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp.cpp
# Opt level: O3

bool __thiscall pg::PPSolver::setupRegion(PPSolver *this,int i,int p,bool mustReset)

{
  ulong *puVar1;
  vector<int,std::allocator<int>> *this_00;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  bitset *pbVar5;
  iterator __position;
  pointer piVar6;
  pointer piVar7;
  bool bVar8;
  int *piVar9;
  undefined7 in_register_00000009;
  int *piVar10;
  vector<int,_std::allocator<int>_> *pvVar11;
  ulong uVar12;
  int *piVar13;
  ulong uVar14;
  long lVar15;
  int *piVar16;
  uint64_t *puVar17;
  uint local_3c;
  long local_38;
  
  uVar12 = (ulong)(uint)i;
  local_38 = (long)p * 3;
  pvVar11 = this->regions + p;
  if ((int)CONCAT71(in_register_00000009,mustReset) != 0) {
    piVar10 = (pvVar11->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start;
    piVar9 = (pvVar11->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
LAB_0015a67a:
    if (piVar10 != piVar9) {
      resetRegion(this,p);
    }
    puVar17 = (this->Z)._bits;
    sVar4 = (this->Z)._bitssize;
    if (sVar4 != 0) {
      memset(puVar17,0,sVar4 << 3);
    }
    goto LAB_0015a881;
  }
  piVar10 = (pvVar11->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
            ._M_start;
  piVar9 = (pvVar11->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (piVar10 != piVar9) {
    pbVar5 = (this->super_Solver).disabled;
    piVar13 = this->region;
    puVar17 = (this->Z)._bits;
    piVar16 = piVar10;
    do {
      uVar14 = (ulong)*piVar16;
      uVar2 = piVar13[uVar14];
      if (uVar2 == p) {
        puVar1 = puVar17 + (uVar14 >> 6);
        *puVar1 = *puVar1 | 1L << (uVar14 & 0x3f);
      }
      else if ((((int)uVar2 < p) || ((1L << (uVar14 & 0x3f) & pbVar5->_bits[uVar14 >> 6]) != 0)) ||
              ((p < (int)uVar2 && (((uVar2 ^ p) & 1) != 0)))) goto LAB_0015a67a;
      piVar16 = piVar16 + 1;
    } while (piVar16 != piVar9);
  }
  puVar17 = (this->Z)._bits;
  uVar14 = (long)piVar9 - (long)piVar10;
  if (0 < (long)uVar14 >> 4) {
    lVar15 = ((long)uVar14 >> 4) + 1;
    piVar13 = (int *)((uVar14 & 0xfffffffffffffff0) + (long)piVar10);
    piVar10 = piVar10 + 2;
    do {
      if ((puVar17[(ulong)(long)piVar10[-2] >> 6] >> ((long)piVar10[-2] & 0x3fU) & 1) == 0) {
        piVar10 = piVar10 + -2;
        goto LAB_0015a83e;
      }
      if ((puVar17[(ulong)(long)piVar10[-1] >> 6] >> ((long)piVar10[-1] & 0x3fU) & 1) == 0) {
        piVar10 = piVar10 + -1;
        goto LAB_0015a83e;
      }
      if ((puVar17[(ulong)(long)*piVar10 >> 6] >> ((long)*piVar10 & 0x3fU) & 1) == 0)
      goto LAB_0015a83e;
      if ((puVar17[(ulong)(long)piVar10[1] >> 6] >> ((long)piVar10[1] & 0x3fU) & 1) == 0) {
        piVar10 = piVar10 + 1;
        goto LAB_0015a83e;
      }
      lVar15 = lVar15 + -1;
      piVar10 = piVar10 + 4;
    } while (1 < lVar15);
    uVar14 = (long)piVar9 - (long)piVar13;
    piVar10 = piVar13;
  }
  lVar15 = (long)uVar14 >> 2;
  if (lVar15 == 1) {
LAB_0015a813:
    if ((puVar17[(ulong)(long)*piVar10 >> 6] >> ((long)*piVar10 & 0x3fU) & 1) != 0) {
      piVar10 = piVar9;
    }
  }
  else if (lVar15 == 2) {
LAB_0015a7fb:
    if ((puVar17[(ulong)(long)*piVar10 >> 6] >> ((long)*piVar10 & 0x3fU) & 1) != 0) {
      piVar10 = piVar10 + 1;
      goto LAB_0015a813;
    }
  }
  else {
    if (lVar15 != 3) goto LAB_0015a881;
    if ((puVar17[(ulong)(long)*piVar10 >> 6] >> ((long)*piVar10 & 0x3fU) & 1) != 0) {
      piVar10 = piVar10 + 1;
      goto LAB_0015a7fb;
    }
  }
LAB_0015a83e:
  piVar13 = piVar10 + 1;
  if (piVar13 != piVar9 && piVar10 != piVar9) {
    do {
      iVar3 = *piVar13;
      if ((puVar17[(ulong)(long)iVar3 >> 6] >> ((long)iVar3 & 0x3fU) & 1) != 0) {
        *piVar10 = iVar3;
        piVar10 = piVar10 + 1;
      }
      piVar13 = piVar13 + 1;
    } while (piVar13 != piVar9);
  }
  if (piVar10 != piVar9) {
    (pvVar11->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = piVar10;
  }
LAB_0015a881:
  local_3c = i;
  if (-1 < i) {
    local_3c = i;
    do {
      if (((this->super_Solver).game)->_priority[uVar12] != p) break;
      iVar3 = this->region[uVar12];
      if (iVar3 != -2) {
        if ((((this->super_Solver).disabled)->_bits[uVar12 >> 6] >> (uVar12 & 0x3f) & 1) == 0) {
          if (iVar3 == p) {
            puVar17 = (this->Z)._bits;
            if ((puVar17[uVar12 >> 6] & 1L << (uVar12 & 0x3f)) == 0) {
              this_00 = (vector<int,std::allocator<int>> *)
                        (&(this->regions->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start + local_38);
              __position._M_current = *(int **)(this_00 + 8);
              if (__position._M_current == *(int **)(this_00 + 0x10)) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          (this_00,__position,(int *)&local_3c);
              }
              else {
                *__position._M_current = (int)uVar12;
                *(int **)(this_00 + 8) = __position._M_current + 1;
              }
              this->strategy[(int)local_3c] = -1;
            }
            else {
              uVar14 = (ulong)this->strategy[uVar12];
              if ((uVar14 != 0xffffffffffffffff) &&
                 ((puVar17[uVar14 >> 6] >> (uVar14 & 0x3f) & 1) == 0)) {
                this->strategy[uVar12] = -1;
              }
            }
          }
        }
        else {
          this->region[uVar12] = -2;
        }
      }
      uVar2 = local_3c - 1;
      uVar12 = (ulong)uVar2;
      bVar8 = 0 < (int)local_3c;
      local_3c = uVar2;
    } while (bVar8);
    puVar17 = (this->Z)._bits;
  }
  sVar4 = (this->Z)._bitssize;
  if (sVar4 != 0) {
    memset(puVar17,0,sVar4 << 3);
  }
  piVar6 = (&(this->regions->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start)[local_38];
  piVar7 = (&(this->regions->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish)[local_38];
  if (piVar6 != piVar7) {
    attract(this,p);
  }
  return piVar6 != piVar7;
}

Assistant:

bool
PPSolver::setupRegion(int i, int p, bool mustReset)
{
    // NOTE: a node can be "disabled" and in a region (after dominion attraction)
    
    if (!mustReset) {
        // Check if we must reset anyway (because region is tainted)
        // When must a region be reset?
        // - some vertices are in a dominion (now disabled)
        // - some vertices are already reset (i.e., attracted by opponent, then reset)
        // - some vertices are attracted to a higher OPPONENT region
        // When does a region not need to be reset?
        // - some vertices are attracted to a higher SAME-PARITY region
        for (int i : regions[p]) {
            if (region[i] == p) {
                Z[i] = true;
            } else if (disabled[i] or region[i] < p or (region[i] > p and (region[i]&1) != (p&1))) {
                mustReset = true;
                break;
            }
        }
    }

    if (mustReset) {
        if (!regions[p].empty()) resetRegion(p);
        Z.reset();
    } else {
        // No reset, but remove escapes (to be added) and remove things in a higher region...
        // The reason is that there may be vertices of priority p that are not yet in the region vector
        regions[p].erase(std::remove_if(regions[p].begin(), regions[p].end(),
                [&](const int x){ return Z[x] != 1; }),
                regions[p].end());
    }

    // Add all escapes to regions vector
    for (int j=i; j>=0 && priority(j) == p; j--) {
        if (region[j] == -2) continue; // already known to be disabled
        else if (disabled[j]) region[j] = -2; // set now to region -2
        else if (region[j] == p) { // is [to be] in region!
            if (Z[j]) {
                // already in the region, but check strategy
                if (strategy[j] != -1 and !Z[strategy[j]]) strategy[j] = -1;
                continue;
            } else {
                regions[p].push_back(j);
                strategy[j] = -1;
            }
        }
    }

    Z.reset();

    // If the region is empty, return false
    if (regions[p].empty()) return false;

    // Otherwise, attract and return true
    attract(p);
    return true;
}